

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O3

bool CheckHostPortOptions(ArgsManager *args)

{
  pointer strArg;
  pointer pbVar1;
  bool bVar2;
  int iVar3;
  byte unaff_BPL;
  long lVar4;
  long *plVar5;
  bool bVar6;
  pointer invalid_value;
  long in_FS_OFFSET;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
  __l;
  string_view str;
  string_view in;
  uint16_t n;
  string port;
  string port_option;
  uint16_t local_24a;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_248;
  undefined1 local_230 [32];
  bool local_210;
  undefined7 uStack_20f;
  char *local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  undefined1 local_1e8;
  undefined1 *local_1e0 [2];
  undefined1 local_1d0 [16];
  undefined1 local_1c0;
  undefined1 *local_1b8 [2];
  undefined1 local_1a8 [16];
  undefined1 local_198;
  undefined1 *local_190 [2];
  undefined1 local_180 [16];
  undefined1 local_170;
  undefined1 *local_168 [2];
  undefined1 local_158 [16];
  undefined1 local_148;
  undefined1 *local_140 [2];
  undefined1 local_130 [16];
  undefined1 local_120;
  undefined1 *local_118 [2];
  undefined1 local_108 [16];
  undefined1 local_f8;
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  undefined1 local_d0;
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  undefined1 local_a8;
  long *local_a0 [2];
  long local_90 [2];
  undefined1 local_80;
  undefined1 local_78 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xe8fb61;
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xf7673a;
  lVar4 = 0;
  do {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_58._M_local_buf,
               *(char **)((long)&local_248.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar4),
               (allocator<char> *)local_230);
    bVar2 = ArgsManager::IsArgSet(args,(string *)&local_58);
    bVar6 = true;
    if (bVar2) {
      local_230._0_8_ = local_230 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"");
      ArgsManager::GetArg((string *)local_78,args,(string *)&local_58,(string *)local_230);
      if ((undefined1 *)local_230._0_8_ != local_230 + 0x10) {
        operator_delete((void *)local_230._0_8_,local_230._16_8_ + 1);
      }
      str._M_str = (char *)local_78._0_8_;
      str._M_len = local_78._8_8_;
      bVar2 = ParseUInt16(str,&local_24a);
      bVar6 = bVar2 && local_24a != 0;
      if (!bVar2 || local_24a == 0) {
        common::InvalidPortErrMsg((bilingual_str *)local_230,(string *)&local_58,(string *)local_78)
        ;
        unaff_BPL = InitError((bilingual_str *)local_230);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(uStack_20f,local_210) != &local_200) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(uStack_20f,local_210),local_200._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_230._0_8_ != local_230 + 0x10) {
          operator_delete((void *)local_230._0_8_,local_230._16_8_ + 1);
        }
      }
      if ((string *)local_78._0_8_ != (string *)(local_78 + 0x10)) {
        operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_allocated_capacity != &local_48) {
      operator_delete((void *)local_58._M_allocated_capacity,
                      CONCAT71(local_48._M_allocated_capacity._1_7_,local_48._M_local_buf[0]) + 1);
    }
    if (!bVar6) goto LAB_0089ca70;
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x10);
  local_230._0_8_ = local_230 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"-i2psam","");
  local_210 = false;
  local_208 = local_200._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"-onion","");
  local_1e8 = 1;
  local_1e0[0] = local_1d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"-proxy","");
  local_1c0 = 1;
  local_1b8[0] = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"-rpcbind","");
  local_198 = 0;
  local_190[0] = local_180;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"-torcontrol","");
  local_170 = 0;
  local_168[0] = local_158;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"-whitebind","");
  local_148 = 0;
  local_140[0] = local_130;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"-zmqpubhashblock","");
  local_120 = 1;
  local_118[0] = local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"-zmqpubhashtx","");
  local_f8 = 1;
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"-zmqpubrawblock","");
  local_d0 = 1;
  local_c8[0] = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"-zmqpubrawtx","");
  local_a8 = 1;
  plVar5 = local_90;
  local_a0[0] = plVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"-zmqpubsequence","");
  local_80 = 1;
  __l._M_len = 0xb;
  __l._M_array = (iterator)local_230;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
            *)local_78,__l,(allocator_type *)local_58._M_local_buf);
  lVar4 = -0x1b8;
  do {
    if (plVar5 != (long *)plVar5[-2]) {
      operator_delete((long *)plVar5[-2],*plVar5 + 1);
    }
    plVar5 = plVar5 + -5;
    lVar4 = lVar4 + 0x28;
    strArg = (pointer)local_78._0_8_;
  } while (lVar4 != 0);
  for (; strArg != (pointer)local_78._8_8_; strArg = strArg + 1) {
    ArgsManager::GetArgs(&local_248,args,&strArg->first);
    pbVar1 = local_248.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (invalid_value =
              local_248.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start; invalid_value != pbVar1;
        invalid_value = invalid_value + 1) {
      local_58._M_allocated_capacity = (size_type)&local_48;
      local_58._8_8_ = 0;
      local_48._M_local_buf[0] = '\0';
      local_24a = 0;
      in._M_str = (invalid_value->_M_dataplus)._M_p;
      in._M_len = invalid_value->_M_string_length;
      bVar2 = SplitHostPort(in,&local_24a,(string *)&local_58);
      bVar6 = true;
      if ((!bVar2) &&
         (((strArg->second != true ||
           (invalid_value->_M_string_length < ADDR_PREFIX_UNIX_abi_cxx11_._M_string_length)) ||
          ((ADDR_PREFIX_UNIX_abi_cxx11_._M_string_length != 0 &&
           (iVar3 = bcmp((invalid_value->_M_dataplus)._M_p,
                         ADDR_PREFIX_UNIX_abi_cxx11_._M_dataplus._M_p,
                         ADDR_PREFIX_UNIX_abi_cxx11_._M_string_length), iVar3 != 0)))))) {
        common::InvalidPortErrMsg((bilingual_str *)local_230,&strArg->first,invalid_value);
        unaff_BPL = InitError((bilingual_str *)local_230);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(uStack_20f,local_210) != &local_200) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(uStack_20f,local_210),local_200._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_230._0_8_ != local_230 + 0x10) {
          operator_delete((void *)local_230._0_8_,local_230._16_8_ + 1);
        }
        bVar6 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_allocated_capacity != &local_48) {
        operator_delete((void *)local_58._M_allocated_capacity,
                        CONCAT71(local_48._M_allocated_capacity._1_7_,local_48._M_local_buf[0]) + 1)
        ;
      }
      if (!bVar6) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_248);
        goto LAB_0089ca63;
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_248);
  }
  unaff_BPL = 1;
LAB_0089ca63:
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             *)local_78);
LAB_0089ca70:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)(unaff_BPL & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool CheckHostPortOptions(const ArgsManager& args) {
    for (const std::string port_option : {
        "-port",
        "-rpcport",
    }) {
        if (args.IsArgSet(port_option)) {
            const std::string port = args.GetArg(port_option, "");
            uint16_t n;
            if (!ParseUInt16(port, &n) || n == 0) {
                return InitError(InvalidPortErrMsg(port_option, port));
            }
        }
    }

    for ([[maybe_unused]] const auto& [arg, unix] : std::vector<std::pair<std::string, bool>>{
        // arg name            UNIX socket support
        {"-i2psam",                 false},
        {"-onion",                  true},
        {"-proxy",                  true},
        {"-rpcbind",                false},
        {"-torcontrol",             false},
        {"-whitebind",              false},
        {"-zmqpubhashblock",        true},
        {"-zmqpubhashtx",           true},
        {"-zmqpubrawblock",         true},
        {"-zmqpubrawtx",            true},
        {"-zmqpubsequence",         true},
    }) {
        for (const std::string& socket_addr : args.GetArgs(arg)) {
            std::string host_out;
            uint16_t port_out{0};
            if (!SplitHostPort(socket_addr, port_out, host_out)) {
#ifdef HAVE_SOCKADDR_UN
                // Allow unix domain sockets for some options e.g. unix:/some/file/path
                if (!unix || !socket_addr.starts_with(ADDR_PREFIX_UNIX)) {
                    return InitError(InvalidPortErrMsg(arg, socket_addr));
                }
#else
                return InitError(InvalidPortErrMsg(arg, socket_addr));
#endif
            }
        }
    }

    return true;
}